

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

lys_type * warn_is_equal_type_next_type(lys_type *type,lys_type *prev_type)

{
  lys_node_leaf *plVar1;
  int local_c [2];
  int found;
  
  while( true ) {
    local_c[0] = 0;
    if (type->base != LY_TYPE_LEAFREF) {
      if (type->base == LY_TYPE_UNION) {
        type = lyp_get_next_union_type(type,prev_type,local_c);
      }
      else if (prev_type != (lys_type *)0x0) {
        if (type != prev_type) {
          __assert_fail("type == prev_type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0xb98,
                        "struct lys_type *warn_is_equal_type_next_type(struct lys_type *, struct lys_type *)"
                       );
        }
        type = (lys_type *)0x0;
      }
      return type;
    }
    plVar1 = (type->info).lref.target;
    if (plVar1 == (lys_node_leaf *)0x0) break;
    type = &plVar1->type;
  }
  return type;
}

Assistant:

static struct lys_type *
warn_is_equal_type_next_type(struct lys_type *type, struct lys_type *prev_type)
{
    int found = 0;

    switch (type->base) {
    case LY_TYPE_UNION:
        /* this can, unfortunately, return leafref */
        return lyp_get_next_union_type(type, prev_type, &found);
    case LY_TYPE_LEAFREF:
        if (!type->info.lref.target) {
            /* we are in a grouping */
            return type;
        }
        return warn_is_equal_type_next_type(&type->info.lref.target->type, prev_type);
    default:
        if (prev_type) {
            assert(type == prev_type);
            return NULL;
        } else {
            return type;
        }
    }
}